

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O2

QDebug operator<<(QDebug debug,SocketState state)

{
  long lVar1;
  Stream *pSVar2;
  long *plVar3;
  QDebug *pQVar4;
  int in_EDX;
  undefined4 in_register_00000034;
  QDebug *this;
  char *t;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  
  this = (QDebug *)CONCAT44(in_register_00000034,state);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,this);
  plVar3 = (long *)QDebug::resetFormat();
  *(undefined1 *)(*plVar3 + 0x30) = 0;
  switch(in_EDX) {
  case 0:
    t = "QAbstractSocket::UnconnectedState";
    break;
  case 1:
    t = "QAbstractSocket::HostLookupState";
    break;
  case 2:
    t = "QAbstractSocket::ConnectingState";
    break;
  case 3:
    t = "QAbstractSocket::ConnectedState";
    break;
  case 4:
    t = "QAbstractSocket::BoundState";
    break;
  case 5:
    t = "QAbstractSocket::ListeningState";
    break;
  case 6:
    t = "QAbstractSocket::ClosingState";
    break;
  default:
    pQVar4 = QDebug::operator<<(this,"QAbstractSocket::SocketState(");
    pQVar4 = QDebug::operator<<(pQVar4,in_EDX);
    QDebug::operator<<(pQVar4,')');
    goto LAB_001b53a6;
  }
  QDebug::operator<<(this,t);
LAB_001b53a6:
  pSVar2 = this->stream;
  this->stream = (Stream *)0x0;
  *(Stream **)debug.stream = pSVar2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QDebug)debug.stream;
}

Assistant:

Q_NETWORK_EXPORT QDebug operator<<(QDebug debug, QAbstractSocket::SocketState state)
{
    QDebugStateSaver saver(debug);
    debug.resetFormat().nospace();
    switch (state) {
    case QAbstractSocket::UnconnectedState:
        debug << "QAbstractSocket::UnconnectedState";
        break;
    case QAbstractSocket::HostLookupState:
        debug << "QAbstractSocket::HostLookupState";
        break;
    case QAbstractSocket::ConnectingState:
        debug << "QAbstractSocket::ConnectingState";
        break;
    case QAbstractSocket::ConnectedState:
        debug << "QAbstractSocket::ConnectedState";
        break;
    case QAbstractSocket::BoundState:
        debug << "QAbstractSocket::BoundState";
        break;
    case QAbstractSocket::ListeningState:
        debug << "QAbstractSocket::ListeningState";
        break;
    case QAbstractSocket::ClosingState:
        debug << "QAbstractSocket::ClosingState";
        break;
    default:
        debug << "QAbstractSocket::SocketState(" << int(state) << ')';
        break;
    }
    return debug;
}